

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GLMClassifier::MergeFrom(GLMClassifier *this,GLMClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  StringVector *this_00;
  StringVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/GLMClassifier.pb.cc"
               ,0x2b2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(from->weights_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->offset_,&from->offset_);
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  if (from->classencoding_ != 0) {
    this->classencoding_ = from->classencoding_;
  }
  if (from->_oneof_case_[0] == 0x65) {
    this_01 = mutable_int64classlabels(this);
    from_01 = int64classlabels(from);
    Int64Vector::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    this_00 = mutable_stringclasslabels(this);
    from_00 = stringclasslabels(from);
    StringVector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void GLMClassifier::MergeFrom(const GLMClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.GLMClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  weights_.MergeFrom(from.weights_);
  offset_.MergeFrom(from.offset_);
  if (from.postevaluationtransform() != 0) {
    set_postevaluationtransform(from.postevaluationtransform());
  }
  if (from.classencoding() != 0) {
    set_classencoding(from.classencoding());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}